

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::nxx_decompress(string_view *in,string *out)

{
  int iVar1;
  size_type sVar2;
  const_pointer pvVar3;
  uint8_t *data;
  uint8_t *data_ptr;
  Nxx header;
  string *out_local;
  string_view *in_local;
  
  header._8_8_ = out;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in);
  if (sVar2 < 0x10) {
    fprintf(_stderr,"NXX file too small\n");
    in_local._7_1_ = false;
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(in);
    data_ptr = *(uint8_t **)pvVar3;
    header._0_8_ = *(undefined8 *)(pvVar3 + 8);
    Nxx::to_host_order((Nxx *)&data_ptr);
    data = (uint8_t *)std::basic_string_view<char,_std::char_traits<char>_>::operator[](in,0x10);
    iVar1 = strncmp((char *)&data_ptr,MAGIC_NXCX,4);
    if (iVar1 == 0) {
      in_local._7_1_ = nxcx_decompress((Nxx *)&data_ptr,data,(string *)header._8_8_);
    }
    else {
      iVar1 = strncmp((char *)&data_ptr,MAGIC_NXGX,4);
      if (iVar1 == 0) {
        in_local._7_1_ = nxgx_decompress((Nxx *)&data_ptr,data,(string *)header._8_8_);
      }
      else {
        fprintf(_stderr,"Invalid file magic\n");
        in_local._7_1_ = false;
      }
    }
  }
  return in_local._7_1_;
}

Assistant:

bool nxx_decompress(const std::string_view &in, std::string &out) {
  // Input large enough to contain header?
  if (in.size() < sizeof(Nxx)) {
    fprintf(stderr, "NXX file too small\n");
    return false;
  }

  // Pun header
  Nxx header = *reinterpret_cast<const Nxx *>(in.data());
  header.to_host_order();

  // Check magic
  const uint8_t *data_ptr = reinterpret_cast<const uint8_t *>(&in[sizeof(Nxx)]);
  if (!strncmp(header.magic, MAGIC_NXCX, sizeof(header.magic))) {
    return nxcx_decompress(header, data_ptr, out);
  } else if (!strncmp(header.magic, MAGIC_NXGX, sizeof(header.magic))) {
    return nxgx_decompress(header, data_ptr, out);
  } else {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }
}